

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

void Cec_CnfNodeAddToSolver(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Ptr_t *vFrontier;
  void **ppvVar5;
  Gia_Obj_t *pObj_00;
  ulong uVar6;
  void *pvVar7;
  
  iVar2 = Cec_ObjSatNum(p,pObj);
  if (iVar2 != 0) {
    return;
  }
  uVar3 = (uint)*(undefined8 *)pObj;
  if ((~uVar3 & 0x9fffffff) == 0) {
    Vec_PtrPush(p->vUsedNodes,pObj);
    iVar2 = p->nSatVars;
    p->nSatVars = iVar2 + 1;
    Cec_ObjSetSatNum(p,pObj,iVar2);
    sat_solver_setnvars(p->pSat,p->nSatVars);
    return;
  }
  if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                  ,0x141,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vFrontier->pArray = ppvVar5;
  Cec_ObjAddToFrontier(p,pObj,vFrontier);
  iVar2 = 0;
  while( true ) {
    if (vFrontier->nSize <= iVar2) {
      free(vFrontier->pArray);
      free(vFrontier);
      return;
    }
    pObj_00 = (Gia_Obj_t *)Vec_PtrEntry(vFrontier,iVar2);
    iVar4 = Cec_ObjSatNum(p,pObj_00);
    if (iVar4 == 0) break;
    iVar4 = Gia_ObjIsMuxType(pObj_00);
    pVVar1 = p->vFanins;
    if (iVar4 == 0) {
      Cec_CollectSuper(pObj_00,1,pVVar1);
      for (iVar4 = 0; pVVar1 = p->vFanins, iVar4 < pVVar1->nSize; iVar4 = iVar4 + 1) {
        pvVar7 = Vec_PtrEntry(pVVar1,iVar4);
        Cec_ObjAddToFrontier(p,(Gia_Obj_t *)((ulong)pvVar7 & 0xfffffffffffffffe),vFrontier);
      }
      Cec_AddClausesSuper(p,pObj_00,pVVar1);
    }
    else {
      pVVar1->nSize = 0;
      Vec_PtrPushUnique(pVVar1,pObj_00 + (-(*(ulong *)pObj_00 & 0x1fffffff) -
                                         (*(ulong *)(pObj_00 + -(*(ulong *)pObj_00 & 0x1fffffff)) &
                                         0x1fffffff)));
      uVar6 = (ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff;
      Vec_PtrPushUnique(p->vFanins,pObj_00 + (-uVar6 - (*(ulong *)(pObj_00 + -uVar6) & 0x1fffffff)))
      ;
      Vec_PtrPushUnique(p->vFanins,
                        pObj_00 + (-(*(ulong *)pObj_00 & 0x1fffffff) -
                                  ((ulong)*(uint *)&pObj_00[-(*(ulong *)pObj_00 & 0x1fffffff)].
                                                    field_0x4 & 0x1fffffff)));
      uVar6 = (ulong)*(uint *)&pObj_00->field_0x4 & 0x1fffffff;
      Vec_PtrPushUnique(p->vFanins,
                        pObj_00 + (-uVar6 - ((ulong)*(uint *)&pObj_00[-uVar6].field_0x4 & 0x1fffffff
                                            )));
      for (iVar4 = 0; iVar4 < p->vFanins->nSize; iVar4 = iVar4 + 1) {
        pvVar7 = Vec_PtrEntry(p->vFanins,iVar4);
        Cec_ObjAddToFrontier(p,(Gia_Obj_t *)((ulong)pvVar7 & 0xfffffffffffffffe),vFrontier);
      }
      Cec_AddClausesMux(p,pObj_00);
    }
    iVar2 = iVar2 + 1;
    if (p->vFanins->nSize < 2) {
      __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                    ,0x15c,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
    }
  }
  __assert_fail("Cec_ObjSatNum(p,pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                ,0x149,"void Cec_CnfNodeAddToSolver(Cec_ManSat_t *, Gia_Obj_t *)");
}

Assistant:

void Cec_CnfNodeAddToSolver( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Gia_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Cec_ObjSatNum(p,pObj) )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_PtrPush( p->vUsedNodes, pObj );
        Cec_ObjSetSatNum( p, pObj, p->nSatVars++ );
        sat_solver_setnvars( p->pSat, p->nSatVars );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Cec_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Gia_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesMux( p, pNode );
        }
        else
        {
            Cec_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, p->vFanins, pFanin, k )
                Cec_ObjAddToFrontier( p, Gia_Regular(pFanin), vFrontier );
            Cec_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}